

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::anon_unknown_28::PrintBytesInObjectToImpl(uchar *obj_bytes,size_t count,ostream *os)

{
  ostream *poVar1;
  ulong start;
  size_t resume_pos;
  size_t kChunkSize;
  size_t kThreshold;
  ostream *os_local;
  size_t count_local;
  uchar *obj_bytes_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,count);
  std::operator<<(poVar1,"-byte object <");
  if (count < 0x84) {
    PrintByteSegmentInObjectTo(obj_bytes,0,count,os);
  }
  else {
    PrintByteSegmentInObjectTo(obj_bytes,0,0x40,os);
    std::operator<<(os," ... ");
    start = count - 0x3f & 0xfffffffffffffffe;
    PrintByteSegmentInObjectTo(obj_bytes,start,count - start,os);
  }
  std::operator<<(os,">");
  return;
}

Assistant:

void PrintBytesInObjectToImpl(const unsigned char* obj_bytes, size_t count,
                              ostream* os) {
  // Tells the user how big the object is.
  *os << count << "-byte object <";

  const size_t kThreshold = 132;
  const size_t kChunkSize = 64;
  // If the object size is bigger than kThreshold, we'll have to omit
  // some details by printing only the first and the last kChunkSize
  // bytes.
  // TODO(wan): let the user control the threshold using a flag.
  if (count < kThreshold) {
    PrintByteSegmentInObjectTo(obj_bytes, 0, count, os);
  } else {
    PrintByteSegmentInObjectTo(obj_bytes, 0, kChunkSize, os);
    *os << " ... ";
    // Rounds up to 2-byte boundary.
    const size_t resume_pos = (count - kChunkSize + 1)/2*2;
    PrintByteSegmentInObjectTo(obj_bytes, resume_pos, count - resume_pos, os);
  }
  *os << ">";
}